

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O1

Result * CoreML::validateInputOutputRankEquality
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,string *layerType,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *blobNameToRank)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  string *psVar3;
  pointer pcVar4;
  LogMessage *pLVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  long *plVar8;
  long *plVar9;
  string err;
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  string local_1b8;
  string *local_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150 [2];
  long local_140 [2];
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_198 = layerType;
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar5 = google::protobuf::internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&blobNameToRank->_M_t,
                 (key_type *)((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  p_Var1 = &(blobNameToRank->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar6._M_node != p_Var1) {
    if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&blobNameToRank->_M_t,
                   (key_type *)((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
    if ((_Rb_tree_header *)iVar6._M_node != p_Var1) {
      if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           (&local_68,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar5);
        google::protobuf::internal::LogMessage::~LogMessage(&local_68);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::at(blobNameToRank,
                    (key_type *)((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
      iVar2 = *pmVar7;
      if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_110,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           (&local_110,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar5);
        google::protobuf::internal::LogMessage::~LogMessage(&local_110);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::at(blobNameToRank,
                    (key_type *)((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
      if (iVar2 != *pmVar7) {
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_local_buf[0] = '\0';
        psVar3 = (layer->name_).ptr_;
        pcVar4 = (psVar3->_M_dataplus)._M_p;
        local_150[0] = local_140;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_150,pcVar4,pcVar4 + psVar3->_M_string_length);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_150,0,(char *)0x0,0x328d97);
        local_1d8 = &local_1c8;
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_1c8 = *plVar9;
          lStack_1c0 = plVar8[3];
        }
        else {
          local_1c8 = *plVar9;
          local_1d8 = (long *)*plVar8;
        }
        local_1d0 = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_1d8);
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_180 = *plVar9;
          lStack_178 = plVar8[3];
          local_190 = &local_180;
        }
        else {
          local_180 = *plVar9;
          local_190 = (long *)*plVar8;
        }
        local_188 = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_190,(ulong)(local_198->_M_dataplus)._M_p);
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_160 = *plVar9;
          lStack_158 = plVar8[3];
          local_170 = &local_160;
        }
        else {
          local_160 = *plVar9;
          local_170 = (long *)*plVar8;
        }
        local_168 = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_170);
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_120 = *plVar9;
          lStack_118 = plVar8[3];
          local_130 = &local_120;
        }
        else {
          local_120 = *plVar9;
          local_130 = (long *)*plVar8;
        }
        local_128 = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_130);
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_170 != &local_160) {
          operator_delete(local_170,local_160 + 1);
        }
        if (local_190 != &local_180) {
          operator_delete(local_190,local_180 + 1);
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8,local_1c8 + 1);
        }
        if (local_150[0] != local_140) {
          operator_delete(local_150[0],local_140[0] + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p == &local_1b8.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_1b8._M_dataplus._M_p,
                        CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                 local_1b8.field_2._M_local_buf[0]) + 1);
        return __return_storage_ptr__;
      }
    }
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateInputOutputRankEquality(const Specification::NeuralNetworkLayer& layer, std::string layerType,
                                              std::map<std::string, int>& blobNameToRank) {
    
    if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
        blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
        if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.output(0))) {
            std::string err;
            err = "Layer '" + std::string(layer.name()) + "' of type '" + layerType + "' expects equal ranks for its input and output, but they are not equal.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}